

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altref_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_44452f::GoldenFrameIntervalTestLarge::~GoldenFrameIntervalTestLarge
          (GoldenFrameIntervalTestLarge *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

~GoldenFrameIntervalTestLarge() override = default;